

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O0

void __thiscall AvlTree<Worker>::insert<Worker>(AvlTree<Worker> *this,Worker *obj)

{
  AvlTree<Worker> local_28;
  Worker *local_18;
  Worker *obj_local;
  AvlTree<Worker> *this_local;
  
  local_18 = obj;
  obj_local = (Worker *)this;
  _insert(&local_28,&this->m_Root,(Worker *)this);
  std::shared_ptr<AvlTree<Worker>::Node>::operator=(&this->m_Root,&local_28.m_Root);
  std::shared_ptr<AvlTree<Worker>::Node>::~shared_ptr(&local_28.m_Root);
  return;
}

Assistant:

void insert(T1&& obj)
   {
        m_Root = _insert(m_Root, obj);
   }